

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_advance_to_peeked(Parser *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  undefined1 uVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  ro_substr chars;
  csubstr cVar11;
  char *pcStack_78;
  size_t local_70;
  char msg [77];
  
  bVar10 = 0;
  _line_progressed(this,(this->m_state->line_contents).rem.len);
  _line_ended(this);
  chars.len = 2;
  chars.str = "\r\n";
  sVar6 = basic_substring<const_char>::first_of(&(this->m_state->line_contents).rem,chars,0);
  if (sVar6 != 0xffffffffffffffff) {
    pcVar8 = "check failed: (m_state->line_contents.rem.first_of(\"\\r\\n\") == csubstr::npos)";
    pcVar9 = msg;
    for (lVar7 = 0x4d; lVar7 != 0; lVar7 = lVar7 + -1) {
      *pcVar9 = *pcVar8;
      pcVar8 = pcVar8 + (ulong)bVar10 * -2 + 1;
      pcVar9 = pcVar9 + (ulong)bVar10 * -2 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        uVar5 = (*pcVar2)();
        return (bool)uVar5;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar11.len;
    pcStack_78 = cVar11.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x763c) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x763c) << 0x40,8);
    LVar3.name.str = pcStack_78;
    LVar3.name.len = local_70;
    (*p_Var1)(msg,0x4d,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  _scan_line(this);
  return (this->m_state->pos).super_LineCol.offset < (this->m_buf).len;
}

Assistant:

bool Parser::_advance_to_peeked()
{
    _line_progressed(m_state->line_contents.rem.len);
    _line_ended(); // advances to the peeked-at line, consuming all remaining (probably newline) characters on the current line
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.rem.first_of("\r\n") == csubstr::npos);
    _c4dbgpf("advance to peeked: scan more... pos={} len={}", m_state->pos.offset, m_buf.len);
    _scan_line();  // puts the peeked-at line in the buffer
    if(_finished_file())
    {
        _c4dbgp("rscalar: finished file!");
        return false;
    }
    return true;
}